

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O0

void stringcache_destroy(StringCache *cache)

{
  StringBucket *pSVar1;
  StringBucket *next;
  StringBucket *bucket;
  size_t i;
  StringCache *cache_local;
  
  if (cache != (StringCache *)0x0) {
    for (bucket = (StringBucket *)0x0; bucket < (StringBucket *)(ulong)cache->table_size;
        bucket = (StringBucket *)((long)&bucket->string + 1)) {
      next = cache->hashtable[(long)bucket];
      cache->hashtable[(long)bucket] = (StringBucket *)0x0;
      while (next != (StringBucket *)0x0) {
        pSVar1 = next->next;
        free(next);
        next = pSVar1;
      }
    }
    free(cache->hashtable);
    free(cache);
  }
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    size_t i;

    if (cache == NULL)
        return;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            free(bucket);
            bucket = next;
        } // while
    } // for

    free(cache->hashtable);
    free(cache);
}